

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

string * __thiscall
yy::mylanguage_parser::yytnamerr__abi_cxx11_
          (string *__return_storage_ptr__,mylanguage_parser *this,char *yystr)

{
  char cVar1;
  string *yyr;
  mylanguage_parser *pmVar2;
  allocator local_21;
  
  if (*(char *)&this->_vptr_mylanguage_parser == '\"') {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    pmVar2 = this;
    do {
      cVar1 = *(char *)((long)&pmVar2->_vptr_mylanguage_parser + 1);
      if (cVar1 == '\\') {
        if (*(char *)((long)&pmVar2->_vptr_mylanguage_parser + 2) != '\\') goto LAB_0010a63e;
        pmVar2 = (mylanguage_parser *)((long)&pmVar2->_vptr_mylanguage_parser + 2);
      }
      else {
        if (cVar1 == '\"') {
          return __return_storage_ptr__;
        }
        if ((cVar1 == '\'') || (cVar1 == ',')) goto LAB_0010a63e;
        pmVar2 = (mylanguage_parser *)((long)&pmVar2->_vptr_mylanguage_parser + 1);
      }
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    } while( true );
  }
LAB_0010a646:
  std::__cxx11::string::string((string *)__return_storage_ptr__,(char *)this,&local_21);
  return __return_storage_ptr__;
LAB_0010a63e:
  std::__cxx11::string::~string((string *)__return_storage_ptr__);
  goto LAB_0010a646;
}

Assistant:

std::string
  mylanguage_parser::yytnamerr_ (const char *yystr)
  {
    if (*yystr == '"')
      {
        std::string yyr;
        char const *yyp = yystr;

        for (;;)
          switch (*++yyp)
            {
            case '\'':
            case ',':
              goto do_not_strip_quotes;

            case '\\':
              if (*++yyp != '\\')
                goto do_not_strip_quotes;
              else
                goto append;

            append:
            default:
              yyr += *yyp;
              break;

            case '"':
              return yyr;
            }
      do_not_strip_quotes: ;
      }

    return yystr;
  }